

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O0

entry_type __thiscall fasttext::Dictionary::getType(Dictionary *this,int32_t id)

{
  const_reference pvVar1;
  int in_ESI;
  long in_RDI;
  
  if (in_ESI < 0) {
    __assert_fail("id >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tshev[P]faster-FastText/src/dictionary.cc"
                  ,0x8c,"entry_type fasttext::Dictionary::getType(int32_t) const");
  }
  if (in_ESI < *(int *)(in_RDI + 0x58)) {
    pvVar1 = std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::operator[]
                       ((vector<fasttext::entry,_std::allocator<fasttext::entry>_> *)(in_RDI + 0x28)
                        ,(long)in_ESI);
    return pvVar1->type;
  }
  __assert_fail("id < size_",
                "/workspace/llm4binary/github/license_c_cmakelists/tshev[P]faster-FastText/src/dictionary.cc"
                ,0x8d,"entry_type fasttext::Dictionary::getType(int32_t) const");
}

Assistant:

entry_type Dictionary::getType(int32_t id) const {
  assert(id >= 0);
  assert(id < size_);
  return words_[id].type;
}